

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborparser.c
# Opt level: O0

CborError cbor_value_leave_container(CborValue *it,CborValue *recursed)

{
  CborError CVar1;
  CborValue *in_RSI;
  CborValue *in_RDI;
  CborValue *in_stack_ffffffffffffffe8;
  
  cbor_value_is_container(in_RDI);
  copy_current_position(in_RDI,in_RSI);
  if ((in_RSI->flags & 0x10) != 0) {
    advance_bytes(in_RSI,(size_t)in_stack_ffffffffffffffe8);
  }
  CVar1 = preparse_next_value(in_stack_ffffffffffffffe8);
  return CVar1;
}

Assistant:

CborError cbor_value_leave_container(CborValue *it, const CborValue *recursed)
{
    cbor_assert(cbor_value_is_container(it));
    cbor_assert(recursed->type == CborInvalidType);

    copy_current_position(it, recursed);
    if (recursed->flags & CborIteratorFlag_UnknownLength)
        advance_bytes(it, 1);
    return preparse_next_value(it);
}